

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiID id_00;
  float *pfVar1;
  undefined4 in_EDI;
  float size_contents;
  float size_avail;
  ImDrawCornerFlags rounding_corners;
  ImRect bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImDrawCornerFlags in_stack_0000008c;
  float in_stack_00000090;
  float in_stack_00000094;
  float *in_stack_00000098;
  ImGuiAxis in_stack_000000a0;
  ImGuiID in_stack_000000a4;
  ImRect *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffb8;
  float fVar2;
  undefined4 in_stack_ffffffffffffffbc;
  float fVar3;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ImGuiAxis in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ImGuiAxis in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  id_00 = GetWindowScrollbarID
                    ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  KeepAliveID(id_00);
  GetWindowScrollbarRect
            ((ImGuiWindow *)CONCAT44(id_00,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  pfVar1 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  fVar2 = *pfVar1;
  ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     CONCAT44(in_stack_ffffffffffffffbc,fVar2));
  pfVar1 = ImVec2::operator[]((ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,fVar2));
  fVar3 = *pfVar1;
  ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     CONCAT44(fVar3,fVar2));
  ImVec2::operator[]((ImVec2 *)CONCAT44(in_EDI,id_00),CONCAT44(fVar3,fVar2));
  ScrollbarEx(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
              in_stack_00000094,in_stack_00000090,in_stack_0000008c);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}